

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

void __thiscall
helics::InterfaceInfo::disconnectFederate
          (InterfaceInfo *this,GlobalFederateId fedToDisconnect,Time disconnectTime)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator this_00;
  const_iterator __rhs;
  baseType in_RDX;
  undefined4 in_ESI;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *ept;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  shared_handle *__range1_1;
  shared_handle ehandle;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *pub;
  const_iterator __end1;
  const_iterator __begin1;
  handle *__range1;
  handle phandle;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  const_iterator __end2;
  const_iterator __begin2;
  shared_handle *__range2;
  shared_handle ihandle;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_fffffffffffffec8;
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_fffffffffffffed0;
  InputInfo *in_stack_fffffffffffffee0;
  undefined1 *puVar3;
  Time in_stack_fffffffffffffee8;
  PublicationInfo *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [28];
  undefined4 local_ac;
  reference local_a8;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *local_a0;
  __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  EndpointInfo *in_stack_ffffffffffffff88;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff90;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [32];
  TimeRepresentation<count_time<9,_long>_> local_10;
  undefined4 local_4;
  
  local_10.internalTimeCode = in_RDX;
  local_4 = in_ESI;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    (&local_10,(TimeRepresentation<count_time<9,_long>_> *)&cBigTime);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock_shared((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                   *)in_stack_fffffffffffffec8);
    local_38 = local_30;
    local_40._M_current =
         (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
         gmlc::libguarded::
         shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
         ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)in_stack_fffffffffffffec8);
    cVar2 = gmlc::libguarded::
            shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                   *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                               *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
      ::operator*(&local_40);
      std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x519af7)
      ;
      in_stack_ffffffffffffff90.internalTimeCode = local_10.internalTimeCode;
      InputInfo::disconnectFederate
                (in_stack_fffffffffffffee0,
                 (GlobalFederateId)(BaseType)((ulong)cVar2._M_current >> 0x20),
                 in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
      ::operator++(&local_40);
    }
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::unlock(in_stack_fffffffffffffed0);
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)0x519b84);
  }
  puVar3 = local_88;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)in_stack_fffffffffffffec8);
  local_90 = puVar3;
  local_98._M_current =
       (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_fffffffffffffec8);
  local_a0 = (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
             gmlc::libguarded::
             lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
             ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
               ::operator*(&local_98);
    std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
    operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *
               )0x519c2d);
    local_ac = local_4;
    PublicationInfo::disconnectFederate
              (in_stack_ffffffffffffff18,
               (GlobalFederateId)(BaseType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
    ::operator++(&local_98);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::unlock((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            *)in_stack_fffffffffffffed0);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock_shared(in_stack_fffffffffffffec8);
  local_d0 = local_c8;
  this_00 = gmlc::libguarded::
            shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)in_stack_fffffffffffffec8);
  local_d8._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)this_00;
  __rhs = gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)this_00._M_current,
                            (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)__rhs._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator*(&local_d8);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x519d0b);
    EndpointInfo::disconnectFederate
              (in_stack_ffffffffffffff88,
               (GlobalFederateId)
               (BaseType)((ulong)in_stack_ffffffffffffff90.internalTimeCode >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(&local_d8);
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::unlock((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            *)this_00._M_current);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x519d68);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x519d75);
  return;
}

Assistant:

void InterfaceInfo::disconnectFederate(GlobalFederateId fedToDisconnect, Time disconnectTime)
{
    if (disconnectTime < cBigTime) {
        auto ihandle = inputs.lock_shared();
        for (auto& ipt : ihandle) {
            ipt->disconnectFederate(fedToDisconnect, disconnectTime);
        }
        ihandle.unlock();
    }

    auto phandle = publications.lock();

    for (auto& pub : phandle) {
        pub->disconnectFederate(fedToDisconnect);
    }
    phandle.unlock();

    auto ehandle = endpoints.lock_shared();

    for (auto& ept : ehandle) {
        ept->disconnectFederate(fedToDisconnect);
    }
    ehandle.unlock();
}